

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgSppPutMem(uchar *ss,uint len)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (len == (uint)lVar2) {
      return 0;
    }
    uVar1 = zvgSppPutc(ss[lVar2]);
    lVar2 = lVar2 + 1;
  } while (uVar1 == 0);
  return uVar1;
}

Assistant:

uint zvgSppPutMem( uchar *ss, uint len)
{
	uint	err;

	err = errOk;

	while (len-- > 0)
	{	err = zvgSppPutc( *ss++);

		if (err)
			break;
	}
	return (err);
}